

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-sched.cpp
# Opt level: O0

ggml_cgraph * gpt2_graph(gpt2_model *model,int n_past,vector<int,_std::allocator<int>_> *embd_inp)

{
  undefined8 uVar1;
  ggml_cgraph *pgVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  const_reference pvVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  vector<int,_std::allocator<int>_> *in_RDX;
  int in_ESI;
  long in_RDI;
  float fVar15;
  ggml_tensor *inpFF;
  ggml_tensor *KQV_merged;
  ggml_tensor *KQV;
  ggml_tensor *V_trans;
  ggml_tensor *KQ_soft_max;
  ggml_tensor *KQ_masked;
  ggml_tensor *KQ_scaled;
  ggml_tensor *KQ;
  ggml_tensor *K;
  ggml_tensor *Q;
  ggml_tensor *v_1;
  ggml_tensor *k;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *cur;
  int il;
  ggml_tensor *inpL;
  float KQ_scale;
  int32_t v;
  int i;
  ggml_tensor *position;
  ggml_tensor *embd;
  ggml_cgraph *gf;
  ggml_context *ctx;
  ggml_init_params params;
  int n_head;
  int n_ctx;
  int n_layer;
  int n_embd;
  gpt2_hparams *hparams;
  int N;
  allocator_type *in_stack_fffffffffffffd10;
  size_type in_stack_fffffffffffffd18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffd20;
  int local_b4;
  long local_b0;
  int local_a0;
  int local_9c;
  undefined8 local_98;
  undefined8 local_90;
  ggml_cgraph *local_88;
  size_t local_80;
  uchar *local_78;
  undefined8 local_70;
  undefined8 local_68;
  size_t local_60;
  uchar *local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  int local_1c;
  int local_c;
  long local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  sVar5 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
  local_1c = (int)sVar5;
  local_28 = local_8;
  local_2c = *(int *)(local_8 + 8);
  local_30 = *(int *)(local_8 + 0x10);
  local_34 = *(int *)(local_8 + 4);
  local_38 = *(int *)(local_8 + 0xc);
  if (gpt2_graph(gpt2_model_const&,int,std::vector<int,std::allocator<int>>const&)::buf_size == '\0'
     ) {
    iVar3 = __cxa_guard_acquire(&gpt2_graph(gpt2_model_const&,int,std::vector<int,std::allocator<int>>const&)
                                 ::buf_size);
    if (iVar3 != 0) {
      lVar6 = ggml_tensor_overhead();
      lVar7 = ggml_graph_overhead_custom(0x1000,0);
      gpt2_graph::buf_size = lVar6 * 0x1000 + lVar7;
      __cxa_guard_release(&gpt2_graph(gpt2_model_const&,int,std::vector<int,std::allocator<int>>const&)
                           ::buf_size);
    }
  }
  if (gpt2_graph(gpt2_model_const&,int,std::vector<int,std::allocator<int>>const&)::buf == '\0') {
    iVar3 = __cxa_guard_acquire(&gpt2_graph(gpt2_model_const&,int,std::vector<int,std::allocator<int>>const&)
                                 ::buf);
    if (iVar3 != 0) {
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x114e35);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x114e60);
      __cxa_atexit(std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector,
                   &gpt2_graph::buf,&__dso_handle);
      __cxa_guard_release(&gpt2_graph(gpt2_model_const&,int,std::vector<int,std::allocator<int>>const&)
                           ::buf);
    }
  }
  local_60 = gpt2_graph::buf_size;
  local_78 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x114ea1);
  local_50 = 1;
  local_80 = local_60;
  local_70 = CONCAT71(uStack_4f,1);
  local_58 = local_78;
  local_68 = ggml_init();
  local_88 = (ggml_cgraph *)ggml_new_graph_custom(local_68,0x1000,0);
  local_90 = ggml_view_1d(local_68,*(undefined8 *)(local_8 + 0xe8),(long)local_1c,0);
  uVar14 = *(undefined8 *)(local_8 + 0xe8);
  piVar8 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x114f7f);
  lVar6 = (long)local_1c;
  lVar7 = ggml_element_size(local_90);
  ggml_backend_tensor_set(uVar14,piVar8,0,lVar6 * lVar7);
  local_98 = ggml_view_1d(local_68,*(undefined8 *)(local_8 + 0xf0),(long)local_1c,0);
  for (local_9c = 0; local_9c < local_1c; local_9c = local_9c + 1) {
    local_a0 = local_c + local_9c;
    ggml_backend_tensor_set(*(undefined8 *)(local_8 + 0xf0),&local_a0,(long)local_9c << 2,4);
  }
  fVar15 = sqrtf((float)*(int *)(local_8 + 8) / (float)*(int *)(local_8 + 0xc));
  uVar14 = local_68;
  uVar9 = ggml_get_rows(local_68,*(undefined8 *)(local_8 + 0x30),local_90);
  uVar10 = ggml_get_rows(local_68,*(undefined8 *)(local_8 + 0x38),local_98);
  local_b0 = ggml_add(uVar14,uVar9,uVar10);
  ggml_set_name(local_b0,"inpL");
  ggml_set_name(*(undefined8 *)(local_b0 + 0x98),"wte");
  ggml_set_name(*(undefined8 *)(local_b0 + 0xa0),"wpe");
  for (local_b4 = 0; local_b4 < local_30; local_b4 = local_b4 + 1) {
    uVar9 = ggml_norm(*(undefined4 *)(local_28 + 0x18),local_68,local_b0);
    ggml_format_name(uVar9,"l%d.norm",local_b4);
    uVar14 = local_68;
    pvVar11 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(local_8 + 0x48),
                         (long)local_b4);
    uVar9 = ggml_mul(uVar14,uVar9,pvVar11->ln_1_g);
    pvVar11 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(local_8 + 0x48),
                         (long)local_b4);
    lVar6 = ggml_add(uVar14,uVar9,pvVar11->ln_1_b);
    ggml_format_name(lVar6,"l%d.ln_1_b",local_b4);
    ggml_format_name(*(undefined8 *)(lVar6 + 0x98),"l%d.ln_1_g",local_b4);
    uVar14 = local_68;
    pvVar11 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(local_8 + 0x48),
                         (long)local_b4);
    uVar9 = ggml_mul_mat(uVar14,pvVar11->c_attn_attn_w,lVar6);
    ggml_format_name(uVar9,"l%d.attn_w",local_b4);
    uVar14 = local_68;
    pvVar11 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(local_8 + 0x48),
                         (long)local_b4);
    lVar6 = ggml_add(uVar14,uVar9,pvVar11->c_attn_attn_b);
    ggml_format_name(lVar6,"l%d.attn_b",local_b4);
    uVar9 = ggml_view_2d(local_68,lVar6,(long)local_2c,(long)local_1c,*(undefined8 *)(lVar6 + 0x38),
                         0);
    uVar10 = ggml_view_2d(local_68,lVar6,(long)local_2c,(long)local_1c,*(undefined8 *)(lVar6 + 0x38)
                          ,(long)local_2c << 2);
    uVar12 = ggml_view_2d(local_68,lVar6,(long)local_2c,(long)local_1c,*(undefined8 *)(lVar6 + 0x38)
                          ,(long)local_2c << 3);
    ggml_format_name(uVar9,"l%d.Qcur",local_b4);
    ggml_format_name(uVar10,"l%d.Kcur",local_b4);
    ggml_format_name(uVar12,"l%d.Vcur",local_b4);
    uVar14 = local_68;
    if (0 < local_1c) {
      uVar1 = *(undefined8 *)(local_8 + 0x60);
      iVar3 = local_1c * local_2c;
      lVar6 = ggml_element_size(*(undefined8 *)(local_8 + 0x60));
      uVar13 = ggml_view_1d(uVar14,uVar1,(long)iVar3,
                            lVar6 * local_2c * (long)(local_b4 * local_34 + local_c));
      uVar1 = local_68;
      uVar14 = *(undefined8 *)(local_8 + 0x68);
      iVar3 = local_1c * local_2c;
      lVar6 = ggml_element_size(*(undefined8 *)(local_8 + 0x68));
      uVar14 = ggml_view_1d(uVar1,uVar14,(long)iVar3,
                            lVar6 * local_2c * (long)(local_b4 * local_34 + local_c));
      pgVar2 = local_88;
      uVar10 = ggml_cpy(local_68,uVar10,uVar13);
      ggml_build_forward_expand(pgVar2,uVar10);
      pgVar2 = local_88;
      uVar14 = ggml_cpy(local_68,uVar12,uVar14);
      ggml_build_forward_expand(pgVar2,uVar14);
    }
    uVar14 = local_68;
    uVar9 = ggml_cont_3d(local_68,uVar9,(long)(local_2c / local_38),(long)local_38,(long)local_1c);
    uVar10 = ggml_permute(uVar14,uVar9,0,2,1,3);
    ggml_format_name(uVar10,"l%d.Q",local_b4);
    uVar9 = local_68;
    uVar14 = *(undefined8 *)(local_8 + 0x60);
    iVar3 = (local_c + local_1c) * local_2c;
    iVar4 = local_b4 * local_34;
    lVar6 = ggml_element_size(*(undefined8 *)(local_8 + 0x60));
    uVar14 = ggml_view_1d(uVar9,uVar14,(long)iVar3,iVar4 * lVar6 * (long)local_2c);
    uVar14 = ggml_reshape_3d(uVar9,uVar14,(long)(local_2c / local_38),(long)local_38,
                             (long)(local_c + local_1c));
    uVar14 = ggml_permute(uVar9,uVar14,0,2,1,3);
    ggml_format_name(uVar14,"l%d.K",local_b4);
    uVar14 = ggml_mul_mat(local_68,uVar14,uVar10);
    ggml_format_name(uVar14,"l%d.KQ",local_b4);
    uVar14 = ggml_scale(1.0 / fVar15,local_68,uVar14);
    ggml_format_name(uVar14,"l%d.KQ_scaled",local_b4);
    uVar14 = ggml_diag_mask_inf(local_68,uVar14,local_c);
    ggml_format_name(uVar14,"l%d.KQ_masked",local_b4);
    uVar10 = ggml_soft_max(local_68,uVar14);
    ggml_format_name(uVar10,"l%d.KQ_soft_max",local_b4);
    uVar9 = local_68;
    uVar14 = *(undefined8 *)(local_8 + 0x68);
    iVar3 = (local_c + local_1c) * local_2c;
    iVar4 = local_b4 * local_34;
    lVar6 = ggml_element_size(*(undefined8 *)(local_8 + 0x68));
    uVar14 = ggml_view_1d(uVar9,uVar14,(long)iVar3,iVar4 * lVar6 * (long)local_2c);
    uVar14 = ggml_reshape_3d(uVar9,uVar14,(long)(local_2c / local_38),(long)local_38,
                             (long)(local_c + local_1c));
    uVar14 = ggml_permute(uVar9,uVar14,1,2,0,3);
    uVar14 = ggml_cont_3d(uVar9,uVar14,(long)(local_c + local_1c),(long)(local_2c / local_38),
                          (long)local_38);
    uVar14 = ggml_mul_mat(local_68,uVar14,uVar10);
    ggml_format_name(uVar14,"l%d.KQV",local_b4);
    uVar14 = ggml_permute(local_68,uVar14,0,2,1,3);
    ggml_format_name(uVar14,"l%d.KQV_merged",local_b4);
    uVar9 = ggml_cont_2d(local_68,uVar14,(long)local_2c,(long)local_1c);
    ggml_format_name(uVar9,"l%d.KQV_merged_contiguous",local_b4);
    uVar14 = local_68;
    pvVar11 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(local_8 + 0x48),
                         (long)local_b4);
    uVar9 = ggml_mul_mat(uVar14,pvVar11->c_attn_proj_w,uVar9);
    ggml_format_name(uVar9,"l%d.attn_proj_w",local_b4);
    uVar14 = local_68;
    pvVar11 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(local_8 + 0x48),
                         (long)local_b4);
    uVar14 = ggml_add(uVar14,uVar9,pvVar11->c_attn_proj_b);
    ggml_format_name(uVar14,"l%d.attn_proj_b",local_b4);
    uVar9 = ggml_add(local_68,uVar14,local_b0);
    ggml_format_name(uVar9,"l%d.add",local_b4);
    uVar10 = ggml_norm(*(undefined4 *)(local_28 + 0x18),local_68,uVar9);
    ggml_format_name(uVar10,"l%d.FFnorm",local_b4);
    uVar14 = local_68;
    pvVar11 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(local_8 + 0x48),
                         (long)local_b4);
    uVar10 = ggml_mul(uVar14,uVar10,pvVar11->ln_2_g);
    pvVar11 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(local_8 + 0x48),
                         (long)local_b4);
    lVar6 = ggml_add(uVar14,uVar10,pvVar11->ln_2_b);
    ggml_format_name(lVar6,"l%d.ln_2_b",local_b4);
    ggml_format_name(*(undefined8 *)(lVar6 + 0x98),"l%d.ln_2_g",local_b4);
    uVar14 = local_68;
    pvVar11 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(local_8 + 0x48),
                         (long)local_b4);
    uVar10 = ggml_mul_mat(uVar14,pvVar11->c_mlp_fc_w,lVar6);
    ggml_format_name(uVar10,"l%d.mlp_fc_w",local_b4);
    uVar14 = local_68;
    pvVar11 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(local_8 + 0x48),
                         (long)local_b4);
    uVar14 = ggml_add(uVar14,uVar10,pvVar11->c_mlp_fc_b);
    ggml_format_name(uVar14,"l%d.mlp_fc_b",local_b4);
    uVar10 = ggml_gelu(local_68,uVar14);
    ggml_format_name(uVar10,"l%d.gelu",local_b4);
    uVar14 = local_68;
    pvVar11 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(local_8 + 0x48),
                         (long)local_b4);
    uVar10 = ggml_mul_mat(uVar14,pvVar11->c_mlp_proj_w,uVar10);
    ggml_format_name(uVar10,"l%d.mlp_proj_w",local_b4);
    uVar14 = local_68;
    pvVar11 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(local_8 + 0x48),
                         (long)local_b4);
    uVar14 = ggml_add(uVar14,uVar10,pvVar11->c_mlp_proj_b);
    ggml_format_name(uVar14,"l%d.mlp_proj_b",local_b4);
    local_b0 = ggml_add(local_68,uVar14,uVar9);
    ggml_format_name(local_b0,"l%d.add2",local_b4);
  }
  uVar9 = ggml_norm(*(undefined4 *)(local_28 + 0x18),local_68,local_b0);
  ggml_format_name(uVar9,"out_norm");
  uVar14 = local_68;
  uVar9 = ggml_mul(local_68,uVar9,*(undefined8 *)(local_8 + 0x20));
  lVar6 = ggml_add(uVar14,uVar9,*(undefined8 *)(local_8 + 0x28));
  ggml_format_name(lVar6,"out_ln_f_b");
  ggml_format_name(*(undefined8 *)(lVar6 + 0x98),"out_ln_f_g");
  uVar14 = ggml_mul_mat(local_68,*(undefined8 *)(local_8 + 0x40),lVar6);
  ggml_format_name(uVar14,"out_lm_head");
  ggml_build_forward_expand(local_88,uVar14);
  ggml_free(local_68);
  return local_88;
}

Assistant:

struct ggml_cgraph * gpt2_graph(
        const gpt2_model & model,
        const int n_past,
        const std::vector<gpt_vocab::id> & embd_inp) {
    const int N = embd_inp.size();

    const auto & hparams = model.hparams;

    const int n_embd  = hparams.n_embd;
    const int n_layer = hparams.n_layer;
    const int n_ctx   = hparams.n_ctx;
    const int n_head  = hparams.n_head;

    // since we are using ggml-alloc, this buffer only needs enough space to hold the ggml_tensor and ggml_cgraph structs, but not the tensor data
    static size_t buf_size = ggml_tensor_overhead()*GPT2_MAX_NODES + ggml_graph_overhead_custom(GPT2_MAX_NODES, false);
    static std::vector<uint8_t> buf(buf_size);

    struct ggml_init_params params = {
        /*.mem_size   =*/ buf_size,
        /*.mem_buffer =*/ buf.data(),
        /*.no_alloc   =*/ true, // the tensors will be allocated later by ggml_gallocr_alloc_graph()
    };

    struct ggml_context * ctx = ggml_init(params);

    struct ggml_cgraph  * gf = ggml_new_graph_custom(ctx, GPT2_MAX_NODES, false);

    struct ggml_tensor * embd = ggml_view_1d(ctx, model.embd, N, 0);

    // set inputs
    // TODO: move to gpt2_eval
    ggml_backend_tensor_set(model.embd, embd_inp.data(), 0, N*ggml_element_size(embd));

    struct ggml_tensor * position = ggml_view_1d(ctx, model.position, N, 0);
    for (int i = 0; i < N; ++i) {
        int32_t v = n_past + i;
        ggml_backend_tensor_set(model.position, &v, i*sizeof(int32_t), sizeof(v));
    }

    const float KQ_scale = 1.0f/sqrtf(float(model.hparams.n_embd)/model.hparams.n_head);

    // wte + wpe
    struct ggml_tensor * inpL =
        ggml_add(ctx,
                ggml_get_rows(ctx, model.wte, embd),
                ggml_get_rows(ctx, model.wpe, position));
    ggml_set_name(inpL, "inpL");
    ggml_set_name(inpL->src[0], "wte");
    ggml_set_name(inpL->src[1], "wpe");

    for (int il = 0; il < n_layer; ++il) {
        struct ggml_tensor * cur;

        // norm
        {
            // [ 768, N]
            cur = ggml_norm(ctx, inpL, hparams.eps);
            ggml_format_name(cur, "l%d.norm", il);

            // cur = ln_1_g*cur + ln_1_b
            // [ 768, N]
            cur = ggml_add(ctx,
                    ggml_mul(ctx,
                        cur,
                        model.layers[il].ln_1_g),
                    model.layers[il].ln_1_b);
            ggml_format_name(cur, "l%d.ln_1_b", il);
            ggml_format_name(cur->src[0], "l%d.ln_1_g", il);
        }

        // attn
        // [2304, 768] - model.layers[il].c_attn_attn_w
        // [2304,   1] - model.layers[il].c_attn_attn_b
        // [ 768,   N] - cur (in)
        // [2304,   N] - cur (out)
        //
        // cur = attn_w*cur + attn_b
        // [2304, N]
        {
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_attn_attn_w,
                    cur);
            ggml_format_name(cur, "l%d.attn_w", il);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_attn_attn_b);
            ggml_format_name(cur, "l%d.attn_b", il);
        }

        // self-attention
        {
            struct ggml_tensor * Qcur = ggml_view_2d(ctx, cur, n_embd, N, cur->nb[1], 0*sizeof(float)*n_embd);
            struct ggml_tensor * Kcur = ggml_view_2d(ctx, cur, n_embd, N, cur->nb[1], 1*sizeof(float)*n_embd);
            struct ggml_tensor * Vcur = ggml_view_2d(ctx, cur, n_embd, N, cur->nb[1], 2*sizeof(float)*n_embd);

            ggml_format_name(Qcur, "l%d.Qcur", il);
            ggml_format_name(Kcur, "l%d.Kcur", il);
            ggml_format_name(Vcur, "l%d.Vcur", il);

            // store key and value to memory
            if (N >= 1) {
                struct ggml_tensor * k = ggml_view_1d(ctx, model.memory_k, N*n_embd, (ggml_element_size(model.memory_k)*n_embd)*(il*n_ctx + n_past));
                struct ggml_tensor * v = ggml_view_1d(ctx, model.memory_v, N*n_embd, (ggml_element_size(model.memory_v)*n_embd)*(il*n_ctx + n_past));

                ggml_build_forward_expand(gf, ggml_cpy(ctx, Kcur, k));
                ggml_build_forward_expand(gf, ggml_cpy(ctx, Vcur, v));
            }

            // Q = Qcur.contiguous().view(n_embd/n_head, n_head, N).permute(0, 2, 1, 3)
            // [64, N, 12]
            struct ggml_tensor * Q =
                ggml_permute(ctx,
                        ggml_cont_3d(ctx, Qcur, n_embd/n_head, n_head, N),
                        0, 2, 1, 3);
            ggml_format_name(Q, "l%d.Q", il);

            // K = Kmem.view(n_embd/n_head, n_head, n_past + N).permute(0, 2, 1, 3)
            // [64, n_past + N, 12]
            struct ggml_tensor * K =
                ggml_permute(ctx,
                        ggml_reshape_3d(ctx,
                            ggml_view_1d(ctx, model.memory_k, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_k)*n_embd),
                            n_embd/n_head, n_head, n_past + N),
                        0, 2, 1, 3);
            ggml_format_name(K, "l%d.K", il);

            // GG: flash attention
            //struct ggml_tensor * V =
            //    ggml_cpy(ctx0,
            //            ggml_permute(ctx0,
            //                ggml_reshape_3d(ctx0,
            //                    ggml_view_1d(ctx0, model.memory_v, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_v)*n_embd),
            //                    n_embd/n_head, n_head, n_past + N),
            //                1, 2, 0, 3),
            //            ggml_new_tensor_3d(ctx0, GGML_TYPE_F32, n_past + N, n_embd/n_head, n_head));

            //struct ggml_tensor * KQV = ggml_flash_attn(ctx0, Q, K, V, true);

            // K * Q
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ = ggml_mul_mat(ctx, K, Q);
            ggml_format_name(KQ, "l%d.KQ", il);

            // KQ_scaled = KQ / sqrt(n_embd/n_head)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_scaled = ggml_scale(ctx, KQ, KQ_scale);
            ggml_format_name(KQ_scaled, "l%d.KQ_scaled", il);

            // KQ_masked = mask_past(KQ_scaled)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_masked = ggml_diag_mask_inf(ctx, KQ_scaled, n_past);
            ggml_format_name(KQ_masked, "l%d.KQ_masked", il);

            // KQ = soft_max(KQ_masked)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_soft_max = ggml_soft_max(ctx, KQ_masked);
            ggml_format_name(KQ_soft_max, "l%d.KQ_soft_max", il);

            // V_trans = Vmem.view(n_embd/n_head, n_head, n_past + N).permute(1, 2, 0, 3).contiguous()
            // [n_past + N, 64, 12]
            struct ggml_tensor * V_trans =
                ggml_cont_3d(ctx,
                        ggml_permute(ctx,
                            ggml_reshape_3d(ctx,
                                ggml_view_1d(ctx, model.memory_v, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_v)*n_embd),
                                n_embd/n_head, n_head, n_past + N),
                            1, 2, 0, 3),
                        n_past + N, n_embd/n_head, n_head);

            // KQV = transpose(V) * KQ_soft_max
            // [64, N, 12]
            struct ggml_tensor * KQV = ggml_mul_mat(ctx, V_trans, KQ_soft_max);
            ggml_format_name(KQV, "l%d.KQV", il);

            // KQV_merged = KQV.permute(0, 2, 1, 3)
            // [64, 12, N]
            struct ggml_tensor * KQV_merged = ggml_permute(ctx, KQV, 0, 2, 1, 3);
            ggml_format_name(KQV_merged, "l%d.KQV_merged", il);

            // cur = KQV_merged.contiguous().view(n_embd, N)
            // [768, N]
            cur = ggml_cont_2d(ctx, KQV_merged, n_embd, N);
            ggml_format_name(cur, "l%d.KQV_merged_contiguous", il);
        }

        // projection
        // [ 768, 768] - model.layers[il].c_attn_proj_w
        // [ 768,   1] - model.layers[il].c_attn_proj_b
        // [ 768,   N] - cur (in)
        // [ 768,   N] - cur (out)
        //
        // cur = proj_w*cur + proj_b
        // [768, N]
        {
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_attn_proj_w,
                    cur);
            ggml_format_name(cur, "l%d.attn_proj_w", il);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_attn_proj_b);
            ggml_format_name(cur, "l%d.attn_proj_b", il);
        }

        // add the input
        cur = ggml_add(ctx, cur, inpL);
        ggml_format_name(cur, "l%d.add", il);

        struct ggml_tensor * inpFF = cur;

        // feed-forward network
        {
            // norm
            {
                cur = ggml_norm(ctx, inpFF, hparams.eps);
                ggml_format_name(cur, "l%d.FFnorm", il);

                // cur = ln_2_g*cur + ln_2_b
                // [ 768, N]
                cur = ggml_add(ctx,
                        ggml_mul(ctx,
                            cur,
                            model.layers[il].ln_2_g),
                        model.layers[il].ln_2_b);
                ggml_format_name(cur, "l%d.ln_2_b", il);
                ggml_format_name(cur->src[0], "l%d.ln_2_g", il);
            }

            // fully connected
            // [3072, 768] - model.layers[il].c_mlp_fc_w
            // [3072,   1] - model.layers[il].c_mlp_fc_b
            // [ 768,   N] - cur (in)
            // [3072,   N] - cur (out)
            //
            // cur = fc_w*cur + fc_b
            // [3072, N]
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_mlp_fc_w,
                    cur);
            ggml_format_name(cur, "l%d.mlp_fc_w", il);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_mlp_fc_b);
            ggml_format_name(cur, "l%d.mlp_fc_b", il);

            // GELU activation
            // [3072, N]
            cur = ggml_gelu(ctx, cur);
            ggml_format_name(cur, "l%d.gelu", il);

            // projection
            // [ 768, 3072] - model.layers[il].c_mlp_proj_w
            // [ 768,    1] - model.layers[il].c_mlp_proj_b
            // [3072,    N] - cur (in)
            // [ 768,    N] - cur (out)
            //
            // cur = proj_w*cur + proj_b
            // [768, N]
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_mlp_proj_w,
                    cur);
            ggml_format_name(cur, "l%d.mlp_proj_w", il);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_mlp_proj_b);
            ggml_format_name(cur, "l%d.mlp_proj_b", il);
        }

        // input for next layer
        inpL = ggml_add(ctx, cur, inpFF);
        ggml_format_name(inpL, "l%d.add2", il);
    }

    // norm
    {
        // [ 768, N]
        inpL = ggml_norm(ctx, inpL, hparams.eps);
        ggml_format_name(inpL, "out_norm");

        // inpL = ln_f_g*inpL + ln_f_b
        // [ 768, N]
        inpL = ggml_add(ctx,
                ggml_mul(ctx,
                    inpL,
                    model.ln_f_g),
                model.ln_f_b);
        ggml_format_name(inpL, "out_ln_f_b");
        ggml_format_name(inpL->src[0], "out_ln_f_g");
    }

    // inpL = WTE * inpL
    // [ 768, 50257] - model.lm_head
    // [ 768, N]     - inpL
    inpL = ggml_mul_mat(ctx, model.lm_head, inpL);
    ggml_format_name(inpL, "out_lm_head");

    // logits -> probs
    //inpL = ggml_soft_max(ctx0, inpL);

    ggml_build_forward_expand(gf, inpL);

    ggml_free(ctx);

    return gf;
}